

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtTriangleIndexVertexArray * __thiscall
cbtCollisionWorldImporter::createMeshInterface
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *meshData)

{
  cbtShortIntIndexTripletData *pcVar1;
  cbtVector3FloatData *pcVar2;
  cbtVector3DoubleData *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  cbtMeshPartData *pcVar5;
  int j_1;
  long lVar6;
  long lVar7;
  int j;
  short *psVar8;
  int i;
  long lVar9;
  short *indexArray;
  cbtIndexedMesh local_88;
  cbtAlignedObjectArray<short_*> *local_58;
  cbtTriangleIndexVertexArray *local_50;
  cbtAlignedObjectArray<unsigned_char_*> *local_48;
  cbtAlignedObjectArray<cbtVector3DoubleData_*> *local_40;
  cbtAlignedObjectArray<int_*> *local_38;
  
  iVar4 = (*this->_vptr_cbtCollisionWorldImporter[0x11])();
  local_50 = (cbtTriangleIndexVertexArray *)CONCAT44(extraout_var,iVar4);
  local_38 = &this->m_indexArrays;
  local_58 = &this->m_shortIndexArrays;
  local_48 = &this->m_charIndexArrays;
  local_40 = &this->m_doubleVertexArrays;
  for (lVar9 = 0; lVar9 < meshData->m_numMeshParts; lVar9 = lVar9 + 1) {
    local_88.m_indexType = PHY_INTEGER;
    local_88.m_vertexType = PHY_FLOAT;
    pcVar5 = meshData->m_meshPartsPtr;
    local_88.m_numTriangles = pcVar5[lVar9].m_numTriangles;
    local_88.m_numVertices = pcVar5[lVar9].m_numVertices;
    if (pcVar5[lVar9].m_indices32 == (cbtIntIndexData *)0x0) {
      if (pcVar5[lVar9].m_3indices16 != (cbtShortIntIndexTripletData *)0x0) {
        local_88.m_indexType = PHY_SHORT;
        local_88.m_vertexType = PHY_FLOAT;
        local_88.m_triangleIndexStride = 6;
        indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numTriangles * 6,0x10);
        cbtAlignedObjectArray<short_*>::push_back(local_58,&indexArray);
        pcVar5 = meshData->m_meshPartsPtr;
        psVar8 = indexArray + 2;
        for (lVar6 = 0; lVar6 < local_88.m_numTriangles; lVar6 = lVar6 + 1) {
          pcVar1 = pcVar5[lVar9].m_3indices16;
          psVar8[-2] = pcVar1[lVar6].m_values[0];
          psVar8[-1] = pcVar1[lVar6].m_values[1];
          *psVar8 = pcVar1[lVar6].m_values[2];
          psVar8 = psVar8 + 3;
        }
        local_88.m_triangleIndexBase = (uchar *)indexArray;
      }
      if (pcVar5[lVar9].m_indices16 != (cbtShortIntIndexData *)0x0) {
        local_88.m_indexType = 3;
        local_88.m_triangleIndexStride = 6;
        indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numTriangles * 6,0x10);
        cbtAlignedObjectArray<short_*>::push_back(local_58,&indexArray);
        pcVar5 = meshData->m_meshPartsPtr;
        for (lVar6 = 0; lVar6 < (long)local_88.m_numTriangles * 3; lVar6 = lVar6 + 1) {
          indexArray[lVar6] = pcVar5[lVar9].m_indices16[lVar6].m_value;
        }
        local_88.m_triangleIndexBase = (uchar *)indexArray;
      }
      if (pcVar5[lVar9].m_3indices8 != (cbtCharIndexTripletData *)0x0) {
        local_88.m_indexType = 5;
        local_88.m_triangleIndexStride = 3;
        indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numTriangles * 3,0x10);
        cbtAlignedObjectArray<unsigned_char_*>::push_back(local_48,(uchar **)&indexArray);
        lVar6 = 0;
        for (lVar7 = 0; lVar7 < local_88.m_numTriangles; lVar7 = lVar7 + 1) {
          *(uchar *)((long)indexArray + lVar6) =
               meshData->m_meshPartsPtr[lVar9].m_3indices8[lVar7].m_values[0];
          *(uchar *)((long)indexArray + lVar6 + 1) =
               meshData->m_meshPartsPtr[lVar9].m_3indices8[lVar7].m_values[1];
          *(uchar *)((long)indexArray + lVar6 + 2) =
               meshData->m_meshPartsPtr[lVar9].m_3indices8[lVar7].m_values[2];
          lVar6 = lVar6 + 3;
        }
        local_88.m_triangleIndexBase = (uchar *)indexArray;
        pcVar5 = meshData->m_meshPartsPtr;
      }
    }
    else {
      local_88.m_triangleIndexStride = 0xc;
      indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numTriangles * 0xc,0x10);
      cbtAlignedObjectArray<int_*>::push_back(local_38,(int **)&indexArray);
      pcVar5 = meshData->m_meshPartsPtr;
      for (lVar6 = 0; lVar6 < (long)local_88.m_numTriangles * 3; lVar6 = lVar6 + 1) {
        *(int *)(indexArray + lVar6 * 2) = pcVar5[lVar9].m_indices32[lVar6].m_value;
      }
      local_88.m_triangleIndexBase = (uchar *)indexArray;
    }
    if (pcVar5[lVar9].m_vertices3f == (cbtVector3FloatData *)0x0) {
      local_88.m_vertexType = 1;
      local_88.m_vertexStride = 0x20;
      indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numVertices << 5,0x10);
      cbtAlignedObjectArray<cbtVector3DoubleData_*>::push_back
                (local_40,(cbtVector3DoubleData **)&indexArray);
      pcVar5 = meshData->m_meshPartsPtr;
      lVar6 = 0x18;
      for (lVar7 = 0; lVar7 < local_88.m_numVertices; lVar7 = lVar7 + 1) {
        pcVar3 = pcVar5[lVar9].m_vertices3d;
        *(undefined8 *)((long)indexArray + lVar6 + -0x18) =
             *(undefined8 *)((long)pcVar3->m_floats + lVar6 + -0x18);
        *(undefined8 *)((long)indexArray + lVar6 + -0x10) =
             *(undefined8 *)((long)pcVar3->m_floats + lVar6 + -0x10);
        *(undefined8 *)((long)indexArray + lVar6 + -8) =
             *(undefined8 *)((long)pcVar3->m_floats + lVar6 + -8);
        *(undefined8 *)((long)indexArray + lVar6) = *(undefined8 *)((long)pcVar3->m_floats + lVar6);
        lVar6 = lVar6 + 0x20;
      }
    }
    else {
      local_88._36_8_ = local_88._36_8_ & 0xffffffff;
      local_88.m_vertexStride = 0x10;
      indexArray = (short *)cbtAlignedAllocInternal((long)local_88.m_numVertices << 4,0x10);
      cbtAlignedObjectArray<cbtVector3FloatData_*>::push_back
                (&this->m_floatVertexArrays,(cbtVector3FloatData **)&indexArray);
      pcVar5 = meshData->m_meshPartsPtr;
      lVar6 = 0xc;
      for (lVar7 = 0; lVar7 < local_88.m_numVertices; lVar7 = lVar7 + 1) {
        pcVar2 = pcVar5[lVar9].m_vertices3f;
        *(undefined4 *)((long)indexArray + lVar6 + -0xc) =
             *(undefined4 *)((long)pcVar2->m_floats + lVar6 + -0xc);
        *(undefined4 *)((long)indexArray + lVar6 + -8) =
             *(undefined4 *)((long)pcVar2->m_floats + lVar6 + -8);
        *(undefined4 *)((long)indexArray + lVar6 + -4) =
             *(undefined4 *)((long)pcVar2->m_floats + lVar6 + -4);
        *(undefined4 *)((long)indexArray + lVar6) = *(undefined4 *)((long)pcVar2->m_floats + lVar6);
        lVar6 = lVar6 + 0x10;
      }
    }
    local_88.m_vertexBase = (uchar *)indexArray;
    if (indexArray != (short *)0x0 && (short *)local_88.m_triangleIndexBase != (short *)0x0) {
      cbtTriangleIndexVertexArray::addIndexedMesh(local_50,&local_88,local_88.m_indexType);
    }
  }
  return local_50;
}

Assistant:

cbtTriangleIndexVertexArray* cbtCollisionWorldImporter::createMeshInterface(cbtStridingMeshInterfaceData& meshData)
{
	cbtTriangleIndexVertexArray* meshInterface = createTriangleMeshContainer();

	for (int i = 0; i < meshData.m_numMeshParts; i++)
	{
		cbtIndexedMesh meshPart;
		meshPart.m_numTriangles = meshData.m_meshPartsPtr[i].m_numTriangles;
		meshPart.m_numVertices = meshData.m_meshPartsPtr[i].m_numVertices;

		if (meshData.m_meshPartsPtr[i].m_indices32)
		{
			meshPart.m_indexType = PHY_INTEGER;
			meshPart.m_triangleIndexStride = 3 * sizeof(int);
			int* indexArray = (int*)cbtAlignedAlloc(sizeof(int) * 3 * meshPart.m_numTriangles, 16);
			m_indexArrays.push_back(indexArray);
			for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
			{
				indexArray[j] = meshData.m_meshPartsPtr[i].m_indices32[j].m_value;
			}
			meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
		}
		else
		{
			if (meshData.m_meshPartsPtr[i].m_3indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = sizeof(short int) * 3;  //sizeof(cbtShortIntIndexTripletData);

				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
			if (meshData.m_meshPartsPtr[i].m_indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = 3 * sizeof(short int);
				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);
				for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
				{
					indexArray[j] = meshData.m_meshPartsPtr[i].m_indices16[j].m_value;
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}

			if (meshData.m_meshPartsPtr[i].m_3indices8)
			{
				meshPart.m_indexType = PHY_UCHAR;
				meshPart.m_triangleIndexStride = sizeof(unsigned char) * 3;

				unsigned char* indexArray = (unsigned char*)cbtAlignedAlloc(sizeof(unsigned char) * 3 * meshPart.m_numTriangles, 16);
				m_charIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
		}

		if (meshData.m_meshPartsPtr[i].m_vertices3f)
		{
			meshPart.m_vertexType = PHY_FLOAT;
			meshPart.m_vertexStride = sizeof(cbtVector3FloatData);
			cbtVector3FloatData* vertices = (cbtVector3FloatData*)cbtAlignedAlloc(sizeof(cbtVector3FloatData) * meshPart.m_numVertices, 16);
			m_floatVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}
		else
		{
			meshPart.m_vertexType = PHY_DOUBLE;
			meshPart.m_vertexStride = sizeof(cbtVector3DoubleData);

			cbtVector3DoubleData* vertices = (cbtVector3DoubleData*)cbtAlignedAlloc(sizeof(cbtVector3DoubleData) * meshPart.m_numVertices, 16);
			m_doubleVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}

		if (meshPart.m_triangleIndexBase && meshPart.m_vertexBase)
		{
			meshInterface->addIndexedMesh(meshPart, meshPart.m_indexType);
		}
	}

	return meshInterface;
}